

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O1

void * __thiscall google::protobuf::internal::ExtensionSet::Extension::PrefetchPtr(Extension *this)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  char *pcVar4;
  string *psVar5;
  string *psVar6;
  size_t sVar7;
  ostream *poVar8;
  char *extraout_RDX;
  void *pvVar9;
  LongSooRep *this_00;
  ulong *puVar10;
  CheckOpMessageBuilder aCStack_1e8 [112];
  ios_base aiStack_178 [264];
  void *pvStack_70;
  char acStack_58 [16];
  LongSooRep *pLStack_48;
  ulong auStack_38 [2];
  Extension *pEStack_28;
  LongSooRep LStack_18;
  
  this_00 = &LStack_18;
  bVar1 = (bool)((byte)(this->type - 9) < 4 | this->is_repeated);
  if (bVar1 == (bool)(this->field_0xa & 1)) {
    psVar3 = (string *)0x0;
  }
  else {
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       ((bool)(this->field_0xa & 1),bVar1,
                        "is_pointer == is_repeated || FieldTypeIsPointer(type)");
  }
  if (psVar3 == (string *)0x0) {
    if ((this->field_0xa & 1) != 0) {
      this = (Extension *)(this->field_0).int64_t_value;
    }
    return this;
  }
  PrefetchPtr();
  iVar2 = 2;
  if ((int)psVar3 == 0) {
    iVar2 = this_00->capacity;
  }
  pEStack_28 = this;
  if (iVar2 < 1) {
    pLStack_48 = (LongSooRep *)0x145076;
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar2,0,"Capacity(is_soo) > 0");
  }
  else {
    psVar5 = (string *)0x0;
  }
  if (psVar5 == (string *)0x0) {
    if ((char)psVar3 != '\0') {
      return &this_00->size;
    }
    pcVar4 = LongSooRep::elements(this_00);
    return pcVar4;
  }
  puVar10 = auStack_38;
  pLStack_48 = (LongSooRep *)0x145085;
  RepeatedField<int>::elements();
  pcVar4 = acStack_58;
  pvVar9 = (void *)(*puVar10 & 0xfffffffffffffff8);
  pLStack_48 = this_00;
  if (pvVar9 == (void *)0x0) {
    psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<char_const*,void_const*>
                       ((char *)0x0,(void *)0x0,"ret != nullptr");
  }
  else {
    psVar6 = (string *)0x0;
  }
  if (psVar6 == (string *)0x0) {
    return pvVar9;
  }
  LongSooRep::elements();
  pvStack_70 = pvVar9;
  absl::lts_20240722::log_internal::CheckOpMessageBuilder::CheckOpMessageBuilder
            (aCStack_1e8,extraout_RDX);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)&absl::lts_20240722::log_internal::kCharNull;
  }
  sVar7 = strlen(pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aCStack_1e8,pcVar4,sVar7);
  poVar8 = (ostream *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::ForVar2();
  absl::lts_20240722::log_internal::MakeCheckOpValueString(poVar8,psVar6);
  pvVar9 = (void *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::NewString_abi_cxx11_();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aCStack_1e8);
  std::ios_base::~ios_base(aiStack_178);
  return pvVar9;
}

Assistant:

const void* PrefetchPtr() const {
      ABSL_DCHECK_EQ(is_pointer, is_repeated || FieldTypeIsPointer(type));
      // We don't want to prefetch invalid/null pointers so if there isn't a
      // pointer to prefetch, then return `this`.
      return is_pointer ? absl::bit_cast<const void*>(ptr) : this;
    }